

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_15accec::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  pointer *ppDVar1;
  pointer *ppPVar2;
  cmStateSnapshot *this_00;
  uint uVar3;
  _Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> _Var4;
  pointer pDVar5;
  pointer __first;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__a;
  cmMakefile *pcVar6;
  pointer puVar7;
  cmInstallGenerator *pcVar8;
  long *plVar9;
  undefined8 *puVar10;
  ValueHolder this_01;
  pointer pcVar11;
  cmFileAPI *this_02;
  cmState *pcVar12;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar13;
  undefined8 uVar14;
  size_type sVar15;
  bool bVar16;
  int iVar17;
  TargetType TVar18;
  ArrayIndex AVar19;
  Value *pVVar20;
  pointer __result;
  pointer pDVar21;
  pointer pDVar22;
  mapped_type_conflict2 *pmVar23;
  iterator iVar24;
  ulong uVar25;
  pointer pPVar26;
  ulong uVar27;
  cmGlobalGenerator *pcVar28;
  string *psVar29;
  cmLocalGenerator *this_03;
  mapped_type *pmVar30;
  cmValue value;
  Value *extraout_RAX;
  _Tp_alloc_type *p_Var31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  long lVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  ValueHolder VVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  _Alloc_hider this_04;
  undefined8 *puVar37;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *p_Var38;
  ulong uVar39;
  pointer pDVar40;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  pointer pPVar41;
  pointer puVar42;
  long *plVar43;
  long lVar44;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  Value childIndexes;
  string buildDir;
  string prefix_1;
  cmStateSnapshot ps;
  string sourceDir;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  string buildDirRel;
  string prefix;
  Target t;
  ValueHolder local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8 [2];
  pointer local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b8;
  _Base_ptr local_4b0;
  string local_4a8;
  string local_488;
  ValueHolder local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  pointer local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [2];
  ValueHolder local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  pointer local_3d0;
  Value *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  PositionType local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_390;
  ValueHolder local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  ValueHolder local_368;
  long local_360;
  long local_358 [3];
  char *local_340;
  _Base_ptr local_338;
  __node_base local_330;
  ulong local_328;
  pointer local_320;
  ulong local_318;
  long local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [8];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [344];
  _Rb_tree_node_base local_158;
  undefined8 local_138;
  _Base_ptr *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined4 local_110;
  undefined8 local_108;
  _Base_ptr p_Stack_100;
  Value local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  undefined8 uStack_90;
  undefined8 local_88;
  _Base_ptr *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_58;
  _Base_ptr p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_3c8 = __return_storage_ptr__;
  Json::Value::Value((Value *)&local_308,this->Config);
  pVVar20 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar20,(Value *)&local_308);
  Json::Value::~Value((Value *)&local_308);
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  paVar32 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98)
  ;
  paVar34 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0)
  ;
  p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)((long)paVar34 - (long)paVar32 >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < p_Var38) {
    local_340 = "vector::reserve";
LAB_003b21f7:
    std::__throw_length_error(local_340);
  }
  pDVar21 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var31 = (_Tp_alloc_type *)0xcccccccccccccccd;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar21 >> 4) *
         -0x3333333333333333) < p_Var38) {
    pDVar40 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::_M_allocate(p_Var38,(size_t)paVar34);
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::_S_relocate((this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_finish,__result,p_Var31);
    pDVar5 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pDVar5 != (pointer)0x0) {
      operator_delete(pDVar5,(long)(this->Directories).
                                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar5
                     );
    }
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar40 - (long)pDVar21) + (long)__result);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var38;
    paVar32 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                   0x98);
    paVar34 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                   0xa0);
    pDVar21 = __result;
  }
  local_390 = paVar34;
  if (paVar32 != paVar34) {
    local_4b0 = (_Base_ptr)&this->DirectoryMap;
    local_3d0 = (pointer)&this->ProjectMap;
    local_338 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_310 = 0x7fffffffffffffd0;
    local_340 = "vector::_M_realloc_insert";
    paVar36 = paVar34;
    do {
      __first = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar22 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar33 = (long)pDVar22 - (long)__first;
      local_4c0 = (pointer)((lVar33 >> 4) * -0x3333333333333333);
      if (pDVar22 ==
          (this->Directories).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar33 == local_310) goto LAB_003b21f7;
        pDVar21 = local_4c0;
        if (pDVar22 == __first) {
          pDVar21 = (pointer)0x1;
        }
        p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   *)((long)pDVar21 + (long)local_4c0);
        p_Var31 = (_Tp_alloc_type *)0x199999999999999;
        if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)0x199999999999998 < p_Var38) {
          p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        if (CARRY8((ulong)pDVar21,(ulong)local_4c0)) {
          p_Var38 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        pDVar21 = std::
                  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_M_allocate(p_Var38,(size_t)paVar34);
        this_00 = (cmStateSnapshot *)((long)pDVar21 + lVar33);
        puVar37 = (undefined8 *)((long)pDVar21 + lVar33 + 0x40);
        *puVar37 = 0;
        puVar37[1] = 0;
        puVar37 = (undefined8 *)((long)pDVar21 + lVar33 + 0x30);
        *puVar37 = 0;
        puVar37[1] = 0;
        puVar37 = (undefined8 *)((long)pDVar21 + lVar33 + 0x20);
        *puVar37 = 0;
        puVar37[1] = 0;
        puVar37 = (undefined8 *)((long)pDVar21 + lVar33 + 0x10);
        *puVar37 = 0;
        puVar37[1] = 0;
        *(undefined8 *)((long)pDVar21 + lVar33) = 0;
        ((undefined8 *)((long)pDVar21 + lVar33))[1] = 0;
        local_438 = paVar32;
        cmStateSnapshot::cmStateSnapshot(this_00,(cmState *)0x0);
        this_00[1].State = (cmState *)0x0;
        Json::Value::Value((Value *)&this_00[1].Position,arrayValue);
        *(undefined1 *)((long)&this_00[3].State + 4) = 0;
        pDVar22 = std::
                  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_S_relocate(__first,pDVar22,pDVar21,p_Var31);
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)(this->Directories).
                                        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first);
        }
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar21;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar22 + 1;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar21 + (long)p_Var38;
        paVar32 = local_438;
        paVar36 = local_390;
      }
      else {
        (pDVar22->TargetIndexes).limit_ = 0;
        pDVar22->ProjectIndex = 0;
        pDVar22->HasInstallRule = false;
        *(undefined3 *)&pDVar22->field_0x4d = 0;
        (pDVar22->TargetIndexes).comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)0x0;
        (pDVar22->TargetIndexes).start_ = 0;
        (pDVar22->TargetIndexes).value_.int_ = 0;
        *(undefined8 *)&(pDVar22->TargetIndexes).bits_ = 0;
        (pDVar22->Snapshot).Position.Position = 0;
        pDVar22->LocalGenerator = (cmLocalGenerator *)0x0;
        (pDVar22->Snapshot).State = (cmState *)0x0;
        (pDVar22->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        cmStateSnapshot::cmStateSnapshot(&pDVar22->Snapshot,(cmState *)0x0);
        pDVar22->LocalGenerator = (cmLocalGenerator *)0x0;
        Json::Value::Value(&pDVar22->TargetIndexes,arrayValue);
        pDVar22->HasInstallRule = false;
        ppDVar1 = &(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
        pDVar21 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&local_4f8,(cmLocalGenerator *)paVar32->_M_allocated_capacity);
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&local_308,(cmStateSnapshot *)&local_4f8);
      local_430 = pDVar21 + ((ulong)local_4c0 & 0xffffffff);
      (local_430->Snapshot).Position.Position = (PositionType)local_2f8;
      (local_430->Snapshot).State = (cmState *)local_308._M_allocated_capacity;
      (local_430->Snapshot).Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_308._8_8_;
      local_430->LocalGenerator = (cmLocalGenerator *)paVar32->_M_allocated_capacity;
      pmVar23 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                              *)local_4b0,&local_430->Snapshot);
      *pmVar23 = (mapped_type_conflict2)local_4c0;
      local_418[0]._0_8_ = (local_430->Snapshot).Position.Position;
      local_428._M_allocated_capacity = (size_type)(local_430->Snapshot).State;
      local_428._8_8_ = (local_430->Snapshot).Position.Tree;
      local_3b8._M_allocated_capacity = local_428._M_allocated_capacity;
      local_3b8._8_8_ = local_428._8_8_;
      local_3a8 = local_418[0]._0_8_;
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_468,(cmStateSnapshot *)&local_428);
      bVar16 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_468);
      if (bVar16) {
        cmStateSnapshot::GetProjectName_abi_cxx11_
                  ((string *)&local_308,(cmStateSnapshot *)&local_468);
        cmStateSnapshot::GetProjectName_abi_cxx11_
                  ((string *)&local_4f8,(cmStateSnapshot *)&local_428);
        VVar35 = local_4f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._8_8_ == paStack_4f0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar17 = bcmp((void *)local_308._M_allocated_capacity,local_4f8.string_,local_308._8_8_)
            ;
            bVar16 = iVar17 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if (VVar35 != local_4e8) {
          operator_delete(VVar35.string_,local_4e8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8) {
          operator_delete((void *)local_308._M_allocated_capacity,(ulong)((long)local_2f8 + 1));
        }
        if (!bVar16) goto LAB_003b089a;
        local_2f8 = (undefined1  [8])local_458[0]._0_8_;
        local_308._M_allocated_capacity = (size_type)local_468;
        local_308._8_8_ = paStack_460;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(local_4b0,(key_type *)&local_308);
        if (iVar24._M_node == local_338) goto LAB_003b21c9;
        AVar19 = (this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar24._M_node[1]._M_right].
                 ProjectIndex;
      }
      else {
LAB_003b089a:
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        __a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->Projects).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar33 = (long)__a - (long)paVar34 >> 3;
        uVar27 = lVar33 * -0x79435e50d79435e5;
        if (__a == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this->Projects).
                      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)__a - (long)paVar34 == 0x7fffffffffffffc8) goto LAB_003b21f7;
          uVar25 = uVar27;
          if (__a == paVar34) {
            uVar25 = 1;
          }
          uVar39 = uVar25 + uVar27;
          if (0xd79435e50d7942 < uVar39) {
            uVar39 = 0xd79435e50d7943;
          }
          if (CARRY8(uVar25,uVar27)) {
            uVar39 = 0xd79435e50d7943;
          }
          local_4b8 = __a;
          local_3c0 = paVar34;
          if (uVar39 == 0) {
            pPVar26 = (pointer)0x0;
          }
          else {
            pPVar26 = (pointer)operator_new(uVar39 * 0x98);
          }
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)(&(pPVar26->Snapshot).State + lVar33),(Project *)paVar34);
          paVar34 = local_3c0;
          pPVar41 = pPVar26;
          if (local_4b8 != local_3c0) {
            do {
              local_318 = uVar27;
              local_320 = pPVar41;
              local_328 = uVar39;
              local_438 = paVar32;
              pcVar12 = (cmState *)paVar34->_M_allocated_capacity;
              pcVar13 = ((PositionType *)((long)paVar34 + 8))->Tree;
              uVar14 = *(undefined8 *)((long)paVar34 + 0x14);
              *(undefined8 *)((long)&(pPVar26->Snapshot).Position.Tree + 4) =
                   *(undefined8 *)((long)paVar34 + 0xc);
              *(undefined8 *)((long)&(pPVar26->Snapshot).Position.Position + 4) = uVar14;
              (pPVar26->Snapshot).State = pcVar12;
              (pPVar26->Snapshot).Position.Tree = pcVar13;
              Json::Value::Value(&pPVar26->ChildIndexes,(Value *)(paVar34 + 2));
              Json::Value::Value(&pPVar26->DirectoryIndexes,(Value *)((long)paVar34 + 0x48));
              Json::Value::Value(&pPVar26->TargetIndexes,(Value *)(paVar34 + 7));
              Json::Value::~Value((Value *)(paVar34 + 7));
              Json::Value::~Value((Value *)((long)paVar34 + 0x48));
              Json::Value::~Value((Value *)(paVar34 + 2));
              pPVar26 = pPVar26 + 1;
              paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar34 + 0x98);
              paVar32 = local_438;
              uVar27 = local_318;
              uVar39 = local_328;
              pPVar41 = local_320;
            } while (paVar34 != local_4b8);
          }
          if (local_3c0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3c0,
                            (long)(this->Projects).
                                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_3c0);
          }
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar41;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar26 + 1;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar41 + uVar39;
          paVar36 = local_390;
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)__a->_M_local_buf,(Project *)paVar34);
          ppPVar2 = &(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar2 = *ppPVar2 + 1;
          pPVar41 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        AVar19 = (ArrayIndex)uVar27;
        uVar27 = uVar27 & 0xffffffff;
        pPVar41[uVar27].Snapshot.Position.Position = local_418[0]._M_allocated_capacity;
        pPVar41[uVar27].Snapshot.State = (cmState *)local_428._M_allocated_capacity;
        pPVar41[uVar27].Snapshot.Position.Tree =
             (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_428._8_8_;
        pmVar23 = std::
                  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                  ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                                *)local_3d0,(key_type *)&local_428);
        *pmVar23 = AVar19;
        bVar16 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_468);
        if (bVar16) {
          local_2f8 = (undefined1  [8])local_458[0]._0_8_;
          local_308._M_allocated_capacity = (size_type)local_468;
          local_308._8_8_ = paStack_460;
          iVar24 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(local_4b0,(key_type *)&local_308);
          if (iVar24._M_node == local_338) goto LAB_003b21c9;
          uVar3 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar24._M_node[1]._M_right].
                  ProjectIndex;
          pPVar41[uVar27].ParentIndex = uVar3;
          pPVar26 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&local_308,AVar19);
          Json::Value::append(&pPVar26[uVar3].ChildIndexes,(Value *)&local_308);
          Json::Value::~Value((Value *)&local_308);
        }
      }
      local_430->ProjectIndex = AVar19;
      pPVar26 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&local_308,(UInt)local_4c0);
      paVar34 = &local_308;
      Json::Value::append(&pPVar26[AVar19].DirectoryIndexes,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar32 + 8);
    } while (paVar32 != paVar36);
    pDVar21 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pDVar40 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar40 != pDVar21) {
    do {
      pcVar6 = (pDVar40[-1].LocalGenerator)->Makefile;
      puVar7 = (pcVar6->InstallGenerators).
               super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar42 = (pcVar6->InstallGenerators).
                     super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar7;
          puVar42 = puVar42 + 1) {
        pcVar8 = (puVar42->_M_t).
                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
        if ((pcVar8 == (cmInstallGenerator *)0x0) ||
           (lVar33 = __dynamic_cast(pcVar8,&cmInstallGenerator::typeinfo,
                                    &cmInstallSubdirectoryGenerator::typeinfo,0), lVar33 == 0)) {
          pDVar40[-1].HasInstallRule = true;
          break;
        }
      }
      pDVar21 = pDVar40 + -1;
      if (pDVar40[-1].HasInstallRule == false) {
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_4f8,
                   &pDVar21->Snapshot);
        paVar32 = paStack_4f0;
        for (VVar35 = local_4f8; VVar35 != paVar32;
            VVar35.string_ = (char *)((long)&(VVar35.map_)->_M_t + 0x18)) {
          cmStateSnapshot::GetBuildsystemDirectory
                    ((cmStateSnapshot *)&local_468,(cmStateSnapshot *)VVar35.map_);
          local_2f8 = (undefined1  [8])local_458[0]._0_8_;
          local_308._M_allocated_capacity = (size_type)local_468;
          local_308._8_8_ = paStack_460;
          iVar24 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_308);
          if ((_Rb_tree_header *)iVar24._M_node ==
              &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header) goto LAB_003b21c9;
          if ((this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar24._M_node[1]._M_right].
              HasInstallRule == true) {
            pDVar40[-1].HasInstallRule = true;
            break;
          }
        }
        if (local_4f8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_4f8.string_,local_4e8[0]._M_allocated_capacity - (long)local_4f8);
        }
      }
      pDVar40 = pDVar21;
    } while (pDVar21 !=
             (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  Json::Value::Value((Value *)&local_3b8,arrayValue);
  local_3f8.int_ = 0;
  paStack_3f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_3e8._M_allocated_capacity = 0;
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  plVar43 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0x98);
  plVar9 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                     0xa0);
  if (plVar43 != plVar9) {
    do {
      puVar10 = *(undefined8 **)(*plVar43 + 0x150);
      for (puVar37 = *(undefined8 **)(*plVar43 + 0x148); paVar32 = paStack_3f0, VVar35 = local_3f8,
          puVar37 != puVar10; puVar37 = puVar37 + 1) {
        local_308._M_allocated_capacity = *puVar37;
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        emplace_back<cmGeneratorTarget*>
                  ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_3f8.bool_
                   ,(cmGeneratorTarget **)&local_308._M_allocated_capacity);
      }
      plVar43 = plVar43 + 1;
    } while (plVar43 != plVar9);
    if (local_3f8 != paStack_3f0) {
      lVar44 = (long)paStack_3f0 - (long)local_3f8;
      uVar27 = lVar44 >> 3;
      lVar33 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar33 == 0; lVar33 = lVar33 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (local_3f8.int_,paStack_3f0,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar44 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (VVar35.int_,paVar32);
      }
      else {
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(VVar35.int_ + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (VVar35.int_,paVar34);
        for (; paVar34 != paVar32;
            paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar34->_M_local_buf + 8)) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                    (paVar34);
        }
      }
    }
  }
  if (local_3f8 != paStack_3f0) {
    local_4c0 = (pointer)&this->TopBuild;
    local_430 = (pointer)&this->DirectoryMap;
    local_4b0 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_3d0 = (pointer)&this->TargetIndexMap;
    local_438 = paStack_3f0;
    VVar35 = local_3f8;
    paVar32 = paStack_3f0;
    do {
      this_01.int_ = *VVar35.int_;
      TVar18 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_01.map_);
      if ((TVar18 != GLOBAL_TARGET) &&
         (bVar16 = cmGeneratorTarget::IsInBuildSystem(this_01), bVar16)) {
        AVar19 = Json::Value::size((Value *)&local_3b8);
        local_4b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_4b8._4_4_,AVar19);
        local_308._8_8_ = this->Config;
        local_388 = this_01;
        local_308._M_allocated_capacity = (size_type)this_01;
        pcVar28 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)this_01.map_);
        psVar29 = cmake::GetHomeDirectory_abi_cxx11_(pcVar28->CMakeInstance);
        local_2f8 = (undefined1  [8])(local_2f0 + 8);
        pcVar11 = (psVar29->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f8,pcVar11,pcVar11 + psVar29->_M_string_length);
        pcVar28 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)this_01.map_);
        psVar29 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar28->CMakeInstance);
        local_2e0._8_8_ = local_2d0 + 8;
        pcVar11 = (psVar29->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_2f0 + 0x18),pcVar11,pcVar11 + psVar29->_M_string_length);
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                  ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)(local_2d0 + 0x18),
                   (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                   ((long)&((PositionType *)(local_308._M_allocated_capacity + 8))->Tree[0xe].Data.
                           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                           ._M_impl.super__Vector_impl_data + 8));
        local_4f8.string_ = (char *)local_4e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4f8,local_2f8,(char *)(local_2f0._0_8_ + (long)local_2f8));
        BacktraceData::BacktraceData((BacktraceData *)(local_2b0 + 0x10),(string *)&local_4f8);
        if (local_4f8 != local_4e8) {
          operator_delete(local_4f8.string_,local_4e8[0]._M_allocated_capacity + 1);
        }
        local_158._M_color = _S_red;
        local_158._M_parent = (_Base_ptr)0x0;
        local_158._M_left = &local_158;
        local_138 = 0;
        local_130 = &p_Stack_100;
        local_128 = 1;
        local_120 = 0;
        uStack_118 = 0;
        local_110 = 0x3f800000;
        local_108 = 0;
        p_Stack_100 = (_Base_ptr)0x0;
        local_158._M_right = local_158._M_left;
        Json::Value::Value(&local_f8,arrayValue);
        local_d0 = &aStack_a0;
        local_c8 = 1;
        local_c0 = 0;
        uStack_b8 = 0;
        local_b0 = 0x3f800000;
        local_88 = 0;
        aStack_a0._8_8_ = 0;
        uStack_90 = 0;
        local_a8 = 0;
        aStack_a0._M_allocated_capacity = 0;
        local_80 = &p_Stack_50;
        local_78 = 1;
        local_70 = 0;
        uStack_68 = 0;
        local_60 = 0x3f800000;
        local_38 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        p_Stack_50 = (_Base_ptr)0x0;
        psVar29 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)this_01.map_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_368,"target-",psVar29);
        if (local_360 != 0) {
          lVar33 = 0;
          do {
            if ((local_368.string_[lVar33] == '\\') || (local_368.string_[lVar33] == '/')) {
              local_368.string_[lVar33] = '_';
            }
            lVar33 = lVar33 + 1;
          } while (local_360 != lVar33);
        }
        if (this->Config->_M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4f8,"-",this->Config);
          std::__cxx11::string::_M_append((char *)&local_368.int_,local_4f8.uint_);
          if (local_4f8 != local_4e8) {
            operator_delete(local_4f8.string_,local_4e8[0]._M_allocated_capacity + 1);
          }
        }
        this_02 = this->FileAPI;
        Target::Dump((Value *)&local_4f8,(Target *)&local_308);
        cmFileAPI::MaybeJsonFile
                  ((Value *)&local_428,this_02,(Value *)&local_4f8,(string *)&local_368);
        Json::Value::~Value((Value *)&local_4f8);
        psVar29 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)this_01.map_);
        Json::Value::Value((Value *)&local_468,psVar29);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"name");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        TargetId(&local_4a8,(cmGeneratorTarget *)this_01.map_,(string *)local_4c0);
        Json::Value::Value((Value *)&local_468,&local_4a8);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"id");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,
                          (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
        }
        this_03 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)this_01.map_);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_488,this_03);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_4a8,(cmStateSnapshot *)&local_488);
        local_458[0]._0_8_ = local_4a8.field_2._M_allocated_capacity;
        local_468.string_ = local_4a8._M_dataplus._M_p;
        paStack_460 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a8._M_string_length;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_430,(key_type *)&local_468);
        if (iVar24._M_node == local_4b0) goto LAB_003b21c9;
        uVar3 = *(uint *)&iVar24._M_node[1]._M_right;
        Json::Value::Value((Value *)&local_468,uVar3);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"directoryIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        pDVar21 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_468,(UInt)local_4b8);
        Json::Value::append(&pDVar21[uVar3].TargetIndexes,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        uVar3 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].ProjectIndex;
        Json::Value::Value((Value *)&local_468,uVar3);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"projectIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        pPVar26 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_468,(UInt)local_4b8);
        Json::Value::append(&pPVar26[uVar3].TargetIndexes,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        pmVar30 = std::__detail::
                  _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_3d0,(key_type *)&local_388.map_);
        paVar32 = local_438;
        *pmVar30 = (UInt)local_4b8;
        if (local_368 != local_358) {
          operator_delete(local_368.string_,local_358[0] + 1);
        }
        Target::~Target((Target *)&local_308);
        Json::Value::append((Value *)&local_3b8,(Value *)&local_428);
        Json::Value::~Value((Value *)&local_428);
      }
      VVar35.string_ =
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&(VVar35.map_)->_M_t)->_M_local_buf + 8;
    } while (VVar35 != paVar32);
  }
  if (local_3f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity - (long)local_3f8);
  }
  pVVar20 = Json::Value::operator[](local_3c8,"targets");
  Json::Value::operator=(pVVar20,(Value *)&local_3b8);
  Json::Value::~Value((Value *)&local_3b8);
  Json::Value::Value((Value *)&local_368,arrayValue);
  pDVar21 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3d0 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar21 != local_3d0) {
    local_430 = (pointer)&this->TopSource;
    local_4b0 = (_Base_ptr)&this->TopBuild;
    local_3c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&this->TargetIndexMap;
    local_4b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      local_488.field_2._M_allocated_capacity = 0x726f746365726964;
      local_488.field_2._M_local_buf[8] = 'y';
      local_488._M_string_length = 9;
      local_488.field_2._M_local_buf[9] = '\0';
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_308);
      cmSystemTools::RelativeIfUnder((string *)&local_3f8,(string *)local_430,psVar29);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_308);
      cmSystemTools::RelativeIfUnder((string *)&local_388,(string *)local_4b0,psVar29);
      bVar16 = cmsys::SystemTools::FileIsFullPath((string *)&local_388);
      if (bVar16) {
        bVar16 = cmsys::SystemTools::FileIsFullPath((string *)&local_3f8);
        if (!bVar16) {
          local_4f8.int_ = 1;
          paStack_4f0 = local_4e8;
          local_4e8[0]._0_1_ = 0x2d;
          local_308._M_allocated_capacity = local_488._M_string_length;
          local_308._8_8_ = local_488._M_dataplus._M_p;
          local_2f8 = (undefined1  [8])0x1;
          local_2f0._8_8_ = paStack_3f0;
          local_2e0._0_8_ = local_3f8;
          views._M_len = 3;
          views._M_array = (iterator)&local_308;
          local_2f0._0_8_ = paStack_4f0;
          cmCatViews_abi_cxx11_((string *)&local_468,views);
          goto LAB_003b1690;
        }
      }
      else {
        local_4f8.int_ = 1;
        paStack_4f0 = local_4e8;
        local_4e8[0]._0_1_ = 0x2d;
        local_308._M_allocated_capacity = local_488._M_string_length;
        local_308._8_8_ = local_488._M_dataplus._M_p;
        local_2f8 = (undefined1  [8])0x1;
        local_2f0._8_8_ = paStack_380;
        local_2e0._0_8_ = local_388;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_308;
        local_2f0._0_8_ = paStack_4f0;
        cmCatViews_abi_cxx11_((string *)&local_468,views_00);
LAB_003b1690:
        std::__cxx11::string::operator=((string *)&local_488,(string *)&local_468.bool_);
        if (local_468 != local_458) {
          operator_delete(local_468.string_,(ulong)(local_458[0]._0_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        lVar33 = 0;
        do {
          if ((local_488._M_dataplus._M_p[lVar33] == '\\') ||
             (local_488._M_dataplus._M_p[lVar33] == '/')) {
            local_488._M_dataplus._M_p[lVar33] = '.';
          }
          lVar33 = lVar33 + 1;
        } while (local_488._M_string_length != lVar33);
      }
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)this->Config;
      if (((PositionType *)((long)paVar32 + 8))->Tree !=
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_308,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar32)
        ;
        std::__cxx11::string::_M_append((char *)&local_488,local_308._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8) {
          operator_delete((void *)local_308._M_allocated_capacity,(ulong)((long)local_2f8 + 1));
        }
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)this->Config;
      }
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pDVar21->LocalGenerator;
      local_2f8 = (undefined1  [8])local_3c0;
      local_4c0 = pDVar21;
      local_308._M_allocated_capacity = (size_type)paVar34;
      local_308._8_8_ = paVar32;
      psVar29 = cmake::GetHomeDirectory_abi_cxx11_
                          (*(cmake **)
                            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)paVar34 + 0x88))->_M_allocated_capacity + 0x78));
      local_2f0._0_8_ = local_2f0 + 0x10;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,pcVar11,pcVar11 + psVar29->_M_string_length);
      psVar29 = cmake::GetHomeOutputDirectory_abi_cxx11_
                          (*(cmake **)
                            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)paVar34 + 0x88))->_M_allocated_capacity + 0x78));
      local_2d0._0_8_ = local_2d0 + 0x10;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2d0,pcVar11,pcVar11 + psVar29->_M_string_length);
      local_4f8.string_ = (char *)local_4e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f8,local_2f0._0_8_,(char *)(local_2f0._8_8_ + local_2f0._0_8_));
      BacktraceData::BacktraceData((BacktraceData *)local_2b0,(string *)&local_4f8);
      if (local_4f8 != local_4e8) {
        operator_delete(local_4f8.string_,local_4e8[0]._M_allocated_capacity + 1);
      }
      local_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)this->FileAPI;
      Json::Value::Value((Value *)&local_428,objectValue);
      Json::Value::Value((Value *)&local_468,objectValue);
      psVar29 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_308._M_allocated_capacity);
      cmSystemTools::RelativeIfUnder(&local_4a8,(string *)local_2f0,psVar29);
      Json::Value::Value((Value *)&local_4f8,&local_4a8);
      pVVar20 = Json::Value::operator[]((Value *)&local_468,"source");
      Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
      }
      psVar29 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_308._M_allocated_capacity);
      cmSystemTools::RelativeIfUnder(&local_4a8,(string *)local_2d0,psVar29);
      Json::Value::Value((Value *)&local_4f8,&local_4a8);
      pVVar20 = Json::Value::operator[]((Value *)&local_468,"build");
      Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
      }
      pVVar20 = Json::Value::operator[]((Value *)&local_428,"paths");
      Json::Value::operator=(pVVar20,(Value *)&local_468);
      Json::Value::~Value((Value *)&local_468);
      Json::Value::Value((Value *)&local_468,arrayValue);
      puVar10 = *(undefined8 **)
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_308._M_allocated_capacity + 0x70))->_M_allocated_capacity + 0x220);
      for (puVar37 = *(undefined8 **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_308._M_allocated_capacity + 0x70))->_M_allocated_capacity + 0x218)
          ; puVar37 != puVar10; puVar37 = puVar37 + 1) {
        DirectoryObject::DumpInstaller
                  ((Value *)&local_4f8,(DirectoryObject *)&local_308,(cmInstallGenerator *)*puVar37)
        ;
        bVar16 = Json::Value::empty((Value *)&local_4f8);
        if (!bVar16) {
          Json::Value::append((Value *)&local_468,(Value *)&local_4f8);
        }
        Json::Value::~Value((Value *)&local_4f8);
      }
      pVVar20 = Json::Value::operator[]((Value *)&local_428,"installers");
      Json::Value::operator=(pVVar20,(Value *)&local_468);
      Json::Value::~Value((Value *)&local_468);
      BacktraceData::Dump((Value *)&local_4f8,(BacktraceData *)local_2b0);
      pDVar21 = local_4c0;
      pVVar20 = Json::Value::operator[]((Value *)&local_428,"backtraceGraph");
      Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      cmFileAPI::MaybeJsonFile
                ((Value *)&local_3b8,(cmFileAPI *)local_438,(Value *)&local_428,&local_488);
      Json::Value::~Value((Value *)&local_428);
      DirectoryObject::~DirectoryObject((DirectoryObject *)&local_308);
      if (local_388 != &local_378) {
        operator_delete(local_388.string_,(ulong)(local_378._M_allocated_capacity + 1));
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_308);
      local_428._M_allocated_capacity = (size_type)local_418;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,pcVar11,pcVar11 + psVar29->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_4f8,(string *)local_430,(string *)&local_428);
      Json::Value::Value((Value *)&local_308,(String *)&local_4f8);
      pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"source");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      if (local_4f8 != local_4e8) {
        operator_delete(local_4f8.string_,local_4e8[0]._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_308);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,pcVar11,pcVar11 + psVar29->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_4f8,(string *)local_4b0,&local_4a8);
      Json::Value::Value((Value *)&local_308,(String *)&local_4f8);
      pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"build");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      if (local_4f8 != local_4e8) {
        operator_delete(local_4f8.string_,local_4e8[0]._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_3f8,&pDVar21->Snapshot);
      bVar16 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_3f8);
      if (bVar16) {
        local_4e8[0]._M_allocated_capacity = local_3e8._M_allocated_capacity;
        local_4f8 = local_3f8;
        paStack_4f0 = paStack_3f0;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_4f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)iVar24._M_node == local_4b8) {
LAB_003b21c9:
          __assert_fail("i != this->DirectoryMap.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPICodemodel.cxx"
                        ,0x26d,
                        "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                       );
        }
        Json::Value::Value((Value *)&local_308,*(UInt *)&iVar24._M_node[1]._M_right);
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"parentIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      Json::Value::Value((Value *)&local_4f8,arrayValue);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_488,
                 &pDVar21->Snapshot);
      sVar15 = local_488._M_string_length;
      for (this_04._M_p = local_488._M_dataplus._M_p; this_04._M_p != (pointer)sVar15;
          this_04._M_p = this_04._M_p + 0x18) {
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_388,(cmStateSnapshot *)this_04._M_p);
        local_458[0]._0_8_ = local_378._M_allocated_capacity;
        local_468 = local_388;
        paStack_460 = paStack_380;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)iVar24._M_node == local_4b8) goto LAB_003b21c9;
        Json::Value::Value((Value *)&local_308,*(UInt *)&iVar24._M_node[1]._M_right);
        Json::Value::append((Value *)&local_4f8,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_488._M_dataplus._M_p,
                        local_488.field_2._M_allocated_capacity - (long)local_488._M_dataplus._M_p);
      }
      bVar16 = Json::Value::empty((Value *)&local_4f8);
      pDVar21 = local_4c0;
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"childIndexes");
        Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      }
      Json::Value::Value((Value *)&local_308,(UInt)*(size_t *)&pDVar21->ProjectIndex);
      pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"projectIndex");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      bVar16 = Json::Value::empty(&pDVar21->TargetIndexes);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"targetIndexes");
        Json::Value::operator=(pVVar20,(Value *)&pDVar21->TargetIndexes);
      }
      local_488.field_2._M_allocated_capacity =
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&(pDVar21->Snapshot).Position.Position)->_M_allocated_capacity;
      local_488._M_dataplus._M_p = (pointer)(pDVar21->Snapshot).State;
      local_488._M_string_length = (size_type)(pDVar21->Snapshot).Position.Tree;
      Json::Value::Value((Value *)&local_468,nullValue);
      local_308._M_allocated_capacity = (size_type)local_2f8;
      local_330._M_nxt = (_Hash_node_base *)&DAT_0000001e;
      local_308._M_allocated_capacity =
           std::__cxx11::string::_M_create(&local_308._M_allocated_capacity,(ulong)&local_330);
      local_2f8 = (undefined1  [8])local_330._M_nxt;
      builtin_strncpy((char *)(local_308._M_allocated_capacity + 0xe),"REQUIRED",8);
      builtin_strncpy((char *)(local_308._M_allocated_capacity + 0x16),"_VERSION",8);
      *(undefined8 *)local_308._M_allocated_capacity = 0x494d5f454b414d43;
      ((PositionType *)(local_308._M_allocated_capacity + 8))->Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x45525f4d554d494e;
      local_308._8_8_ = local_330._M_nxt;
      *(char *)(local_308._M_allocated_capacity + (long)local_330._M_nxt) = '\0';
      value = cmStateSnapshot::GetDefinition(&local_488,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity,(ulong)((long)local_2f8 + 1));
      }
      if (value.Value != (string *)0x0) {
        Json::Value::Value((Value *)&local_308,objectValue);
        Json::Value::operator=((Value *)&local_468,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
        Json::Value::Value((Value *)&local_308,value.Value);
        pVVar20 = Json::Value::operator[]((Value *)&local_468,"string");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      bVar16 = Json::Value::isNull((Value *)&local_468);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"minimumCMakeVersion");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
      }
      if (pDVar21->HasInstallRule == true) {
        Json::Value::Value((Value *)&local_308,true);
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"hasInstallRule");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      Json::Value::~Value((Value *)&local_468);
      Json::Value::~Value((Value *)&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        (ulong)(local_4a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_allocated_capacity != local_418) {
        operator_delete((void *)local_428._M_allocated_capacity,
                        local_418[0]._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)&local_368,(Value *)&local_3b8);
      Json::Value::~Value((Value *)&local_3b8);
      pDVar21 = pDVar21 + 1;
    } while (pDVar21 != local_3d0);
  }
  pVVar20 = Json::Value::operator[](local_3c8,"directories");
  Json::Value::operator=(pVVar20,(Value *)&local_368);
  Json::Value::~Value((Value *)&local_368);
  Json::Value::Value((Value *)&local_468,arrayValue);
  pPVar26 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar41 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar26 != pPVar41) {
    do {
      Json::Value::Value((Value *)&local_4f8,objectValue);
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_428,&pPVar26->Snapshot);
      Json::Value::Value((Value *)&local_308,(String *)&local_428);
      pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"name");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_allocated_capacity != local_418) {
        operator_delete((void *)local_428._M_allocated_capacity,
                        local_418[0]._M_allocated_capacity + 1);
      }
      if (pPVar26->ParentIndex != 0xffffffff) {
        Json::Value::Value((Value *)&local_308,pPVar26->ParentIndex);
        pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"parentIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      bVar16 = Json::Value::empty(&pPVar26->ChildIndexes);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"childIndexes");
        Json::Value::operator=(pVVar20,&pPVar26->ChildIndexes);
      }
      pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"directoryIndexes");
      Json::Value::operator=(pVVar20,&pPVar26->DirectoryIndexes);
      bVar16 = Json::Value::empty(&pPVar26->TargetIndexes);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"targetIndexes");
        Json::Value::operator=(pVVar20,&pPVar26->TargetIndexes);
      }
      Json::Value::append((Value *)&local_468,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      pPVar26 = pPVar26 + 1;
    } while (pPVar26 != pPVar41);
  }
  pVVar20 = Json::Value::operator[](local_3c8,"projects");
  Json::Value::operator=(pVVar20,(Value *)&local_468);
  Json::Value::~Value((Value *)&local_468);
  return extraout_RAX;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}